

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpComms::~TcpComms(TcpComms *this)

{
  TcpComms *in_RDI;
  
  ~TcpComms(in_RDI);
  operator_delete(in_RDI,0x5a0);
  return;
}

Assistant:

TcpComms::~TcpComms()
{
    disconnect();
}